

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_pkt.cc
# Opt level: O2

void bssl::ssl_send_alert(SSL *ssl,int level,int desc)

{
  tuple<err_save_state_st_*,_bssl::internal::Deleter> state;
  UniquePtr<ERR_SAVE_STATE> err_state;
  __uniq_ptr_impl<err_save_state_st,_bssl::internal::Deleter> local_28;
  
  state.super__Tuple_impl<0UL,_err_save_state_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_err_save_state_st_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_err_save_state_st_*,_bssl::internal::Deleter>)ERR_save_state();
  local_28._M_t.super__Tuple_impl<0UL,_err_save_state_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_err_save_state_st_*,_false>._M_head_impl =
       (tuple<err_save_state_st_*,_bssl::internal::Deleter>)
       (tuple<err_save_state_st_*,_bssl::internal::Deleter>)
       state.super__Tuple_impl<0UL,_err_save_state_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_err_save_state_st_*,_false>._M_head_impl;
  ssl_send_alert_impl(ssl,level,desc);
  ERR_restore_state((ERR_SAVE_STATE *)
                    state.super__Tuple_impl<0UL,_err_save_state_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_err_save_state_st_*,_false>._M_head_impl);
  std::unique_ptr<err_save_state_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<err_save_state_st,_bssl::internal::Deleter> *)&local_28);
  return;
}

Assistant:

void ssl_send_alert(SSL *ssl, int level, int desc) {
  // This function is called in response to a fatal error from the peer. Ignore
  // any failures writing the alert and report only the original error. In
  // particular, if the transport uses |SSL_write|, our existing error will be
  // clobbered so we must save and restore the error queue. See
  // https://crbug.com/959305.
  //
  // TODO(davidben): Return the alert out of the handshake, rather than calling
  // this function internally everywhere.
  //
  // TODO(davidben): This does not allow retrying if the alert hit EAGAIN. See
  // https://crbug.com/boringssl/130.
  UniquePtr<ERR_SAVE_STATE> err_state(ERR_save_state());
  ssl_send_alert_impl(ssl, level, desc);
  ERR_restore_state(err_state.get());
}